

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

void sat_solver_analyze_final(sat_solver *s,int hConf,int skip_first)

{
  bool bVar1;
  uint uVar2;
  int *piVar3;
  int *__ptr;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  
  if (hConf == 0) {
    puVar10 = (uint *)0x0;
  }
  else {
    uVar2 = (s->Mem).uPageMask & hConf;
    if (uVar2 == 0) {
LAB_005534d7:
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    puVar10 = (uint *)((s->Mem).pPages[hConf >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar2);
  }
  if ((s->conf_final).size < 0) {
LAB_00553515:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->conf_final).size = 0;
  iVar9 = s->root_level;
  if (iVar9 != 0) {
    if ((s->tagged).size != 0) {
      __assert_fail("veci_size(&s->tagged) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x365,"void sat_solver_analyze_final(sat_solver *, int, int)");
    }
    uVar2 = *puVar10;
    if ((uint)(skip_first != 0) < uVar2 >> 0xb) {
      uVar7 = (ulong)(skip_first != 0);
      do {
        iVar9 = (int)puVar10[uVar7 + 1] >> 1;
        if (0 < s->levels[iVar9]) {
          pcVar4 = s->tags;
          if (pcVar4[iVar9] == '\0') {
            uVar2 = (s->tagged).size;
            piVar3 = (s->tagged).ptr;
            if (uVar2 == (s->tagged).cap) {
              iVar8 = (uVar2 >> 1) * 3;
              if ((int)uVar2 < 4) {
                iVar8 = uVar2 * 2;
              }
              if (piVar3 == (int *)0x0) {
                piVar3 = (int *)malloc((long)iVar8 << 2);
              }
              else {
                piVar3 = (int *)realloc(piVar3,(long)iVar8 << 2);
              }
              (s->tagged).ptr = piVar3;
              if (piVar3 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       (double)(s->tagged).cap * 9.5367431640625e-07,
                       (double)iVar8 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->tagged).cap = iVar8;
              uVar2 = (s->tagged).size;
              pcVar4 = s->tags;
            }
            (s->tagged).size = uVar2 + 1;
            piVar3[(int)uVar2] = iVar9;
          }
          pcVar4[iVar9] = '\x01';
          uVar2 = *puVar10;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar2 >> 0xb);
      iVar9 = s->root_level;
    }
    if (iVar9 < (s->trail_lim).size) {
      piVar3 = (s->trail_lim).ptr;
      iVar9 = piVar3[iVar9];
    }
    else {
      iVar9 = s->qtail + -1;
      piVar3 = (s->trail_lim).ptr;
    }
    if (*piVar3 <= iVar9) {
      lVar5 = (long)iVar9;
      do {
        pcVar4 = s->tags;
        uVar2 = s->trail[lVar5];
        iVar9 = (int)uVar2 >> 1;
        if (pcVar4[iVar9] != '\0') {
          uVar6 = s->reasons[iVar9];
          if (uVar6 == 0) {
            if (s->levels[iVar9] < 1) {
              __assert_fail("var_level(s, x) > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                            ,0x374,"void sat_solver_analyze_final(sat_solver *, int, int)");
            }
            uVar6 = (s->conf_final).size;
            piVar3 = (s->conf_final).ptr;
            if (uVar6 == (s->conf_final).cap) {
              iVar9 = (uVar6 >> 1) * 3;
              if ((int)uVar6 < 4) {
                iVar9 = uVar6 * 2;
              }
              if (piVar3 == (int *)0x0) {
                piVar3 = (int *)malloc((long)iVar9 << 2);
              }
              else {
                piVar3 = (int *)realloc(piVar3,(long)iVar9 << 2);
              }
              (s->conf_final).ptr = piVar3;
              if (piVar3 == (int *)0x0) {
                printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                       (double)(s->conf_final).cap * 9.5367431640625e-07,
                       (double)iVar9 * 9.5367431640625e-07);
                fflush(_stdout);
              }
              (s->conf_final).cap = iVar9;
              uVar6 = (s->conf_final).size;
            }
            (s->conf_final).size = uVar6 + 1;
            piVar3[(int)uVar6] = uVar2 ^ 1;
          }
          else if ((uVar6 & 1) == 0) {
            uVar2 = (s->Mem).uPageMask & uVar6;
            if (uVar2 == 0) goto LAB_005534d7;
            piVar3 = (s->Mem).pPages[(int)uVar6 >> ((byte)(s->Mem).nPageSize & 0x1f)];
            uVar6 = piVar3[(int)uVar2];
            if (0xfff < uVar6) {
              uVar7 = 1;
              do {
                iVar9 = piVar3[(long)(int)uVar2 + uVar7 + 1] >> 1;
                if (0 < s->levels[iVar9]) {
                  pcVar4 = s->tags;
                  if (pcVar4[iVar9] == '\0') {
                    uVar6 = (s->tagged).size;
                    __ptr = (s->tagged).ptr;
                    if (uVar6 == (s->tagged).cap) {
                      iVar8 = (uVar6 >> 1) * 3;
                      if ((int)uVar6 < 4) {
                        iVar8 = uVar6 * 2;
                      }
                      if (__ptr == (int *)0x0) {
                        __ptr = (int *)malloc((long)iVar8 << 2);
                      }
                      else {
                        __ptr = (int *)realloc(__ptr,(long)iVar8 << 2);
                      }
                      (s->tagged).ptr = __ptr;
                      if (__ptr == (int *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               (double)(s->tagged).cap * 9.5367431640625e-07,
                               (double)iVar8 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                      (s->tagged).cap = iVar8;
                      uVar6 = (s->tagged).size;
                      pcVar4 = s->tags;
                    }
                    (s->tagged).size = uVar6 + 1;
                    __ptr[(int)uVar6] = iVar9;
                  }
                  pcVar4[iVar9] = '\x01';
                  uVar6 = piVar3[(int)uVar2];
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar6 >> 0xb);
            }
          }
          else {
            uVar6 = (int)uVar6 >> 2;
            if (((int)uVar6 < 0) || (s->size <= (int)uVar6)) {
              __assert_fail("lit_var(q) >= 0 && lit_var(q) < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                            ,0x379,"void sat_solver_analyze_final(sat_solver *, int, int)");
            }
            if (0 < s->levels[uVar6]) {
              if (pcVar4[uVar6] == '\0') {
                uVar2 = (s->tagged).size;
                piVar3 = (s->tagged).ptr;
                if (uVar2 == (s->tagged).cap) {
                  iVar9 = (uVar2 >> 1) * 3;
                  if ((int)uVar2 < 4) {
                    iVar9 = uVar2 * 2;
                  }
                  if (piVar3 == (int *)0x0) {
                    piVar3 = (int *)malloc((long)iVar9 << 2);
                  }
                  else {
                    piVar3 = (int *)realloc(piVar3,(long)iVar9 << 2);
                  }
                  (s->tagged).ptr = piVar3;
                  if (piVar3 == (int *)0x0) {
                    printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                           (double)(s->tagged).cap * 9.5367431640625e-07,
                           (double)iVar9 * 9.5367431640625e-07);
                    fflush(_stdout);
                  }
                  (s->tagged).cap = iVar9;
                  uVar2 = (s->tagged).size;
                  pcVar4 = s->tags;
                }
                (s->tagged).size = uVar2 + 1;
                piVar3[(int)uVar2] = uVar6;
              }
              pcVar4[uVar6] = '\x01';
            }
          }
        }
        bVar1 = *(s->trail_lim).ptr < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar1);
    }
    iVar9 = (s->tagged).size;
    if (0 < iVar9) {
      piVar3 = (s->tagged).ptr;
      lVar5 = 0;
      do {
        s->tags[piVar3[lVar5]] = '\0';
        lVar5 = lVar5 + 1;
        iVar9 = (s->tagged).size;
      } while (lVar5 < iVar9);
    }
    if (iVar9 < 0) goto LAB_00553515;
    (s->tagged).size = 0;
  }
  return;
}

Assistant:

static void sat_solver_analyze_final(sat_solver* s, int hConf, int skip_first)
{
    clause* conf = clause_read(s, hConf);
    int i, j, start;
    veci_resize(&s->conf_final,0);
    if ( s->root_level == 0 )
        return;
    assert( veci_size(&s->tagged) == 0 );
//    assert( s->tags[lit_var(p)] == l_Undef );
//    s->tags[lit_var(p)] = l_True;
    for (i = skip_first ? 1 : 0; i < clause_size(conf); i++)
    {
        int x = lit_var(clause_begin(conf)[i]);
        if (var_level(s, x) > 0)
            var_set_tag(s, x, 1);
    }

    start = (s->root_level >= veci_size(&s->trail_lim))? s->qtail-1 : (veci_begin(&s->trail_lim))[s->root_level];
    for (i = start; i >= (veci_begin(&s->trail_lim))[0]; i--){
        int x = lit_var(s->trail[i]);
        if (var_tag(s,x)){
            if (s->reasons[x] == 0){
                assert(var_level(s, x) > 0);
                veci_push(&s->conf_final,lit_neg(s->trail[i]));
            }else{
                if (clause_is_lit(s->reasons[x])){
                    lit q = clause_read_lit(s->reasons[x]);
                    assert(lit_var(q) >= 0 && lit_var(q) < s->size);
                    if (var_level(s, lit_var(q)) > 0)
                        var_set_tag(s, lit_var(q), 1);
                }
                else{
                    clause* c = clause_read(s, s->reasons[x]);
                    int* lits = clause_begin(c);
                    for (j = 1; j < clause_size(c); j++)
                        if (var_level(s, lit_var(lits[j])) > 0)
                            var_set_tag(s, lit_var(lits[j]), 1);
                }
            }
        }
    }
    solver2_clear_tags(s,0);
}